

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

void dmrC_kill_bb(dmr_C *C,basic_block *bb)

{
  pseudo_t ppVar1;
  symbol *insn;
  void *pvVar2;
  undefined1 local_48 [8];
  ptr_list_iter insniter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)bb->insns);
  insn = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_48);
  while (insn != (symbol *)0x0) {
    dmrC_kill_insn(C,(instruction *)insn,1);
    ppVar1 = ((anon_union_8_2_14638a90_for_instruction_5 *)&insn->next_id)->target;
    if ((((ppVar1 != (pseudo_t)0x0) && (ppVar1->type != PSEUDO_VOID)) &&
        (ppVar1->type != PSEUDO_VAL)) && ((ppVar1->field_5).sym == insn)) {
      dmrC_convert_instruction_target(C,(instruction *)insn,&C->L->void_pseudo);
    }
    insn = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_48);
  }
  bb->insns = (instruction_list *)0x0;
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)bb->children);
  while (pvVar2 = ptrlist_iter_next((ptr_list_iter *)local_48), pvVar2 != (void *)0x0) {
    ptrlist_remove((ptr_list **)((long)pvVar2 + 0x20),bb,0);
  }
  bb->children = (basic_block_list *)0x0;
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)bb->parents);
  while (pvVar2 = ptrlist_iter_next((ptr_list_iter *)local_48), pvVar2 != (void *)0x0) {
    ptrlist_remove((ptr_list **)((long)pvVar2 + 0x28),bb,0);
  }
  bb->parents = (basic_block_list *)0x0;
  return;
}

Assistant:

void dmrC_kill_bb(struct dmr_C *C, struct basic_block *bb)
{
	struct instruction *insn;
	struct basic_block *child, *parent;

	FOR_EACH_PTR(bb->insns, insn) {
		dmrC_kill_instruction_force(C, insn);
		kill_defs(C, insn);
		/*
		 * We kill unreachable instructions even if they
		 * otherwise aren't "killable" (e.g. volatile loads)
		 */
	} END_FOR_EACH_PTR(insn);
	bb->insns = NULL;

	FOR_EACH_PTR(bb->children, child) {
		dmrC_remove_bb_from_list(&child->parents, bb, 0);
	} END_FOR_EACH_PTR(child);
	bb->children = NULL;

	FOR_EACH_PTR(bb->parents, parent) {
		dmrC_remove_bb_from_list(&parent->children, bb, 0);
	} END_FOR_EACH_PTR(parent);
	bb->parents = NULL;
}